

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O2

string * __thiscall
ThreadRegion::dotName_abi_cxx11_(string *__return_storage_ptr__,ThreadRegion *this)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,this->id_);
  std::operator+(__return_storage_ptr__,"cluster",&local_30);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string ThreadRegion::dotName() { return "cluster" + std::to_string(id_); }